

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O2

void __thiscall DRAG<RemSP>::FirstScan(DRAG<RemSP> *this)

{
  long lVar1;
  char cVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int r;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar13 = (long)*(int *)&pMVar3->field_0x8;
  lVar20 = (long)*(int *)&pMVar3->field_0xc;
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  uVar11 = 0;
  do {
    if (lVar13 <= (long)uVar11) {
      return;
    }
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar9 = **(long **)&pMVar3->field_0x48;
    lVar10 = lVar9 * uVar11 + *(long *)&pMVar3->field_0x10;
    lVar18 = lVar10 - lVar9;
    lVar14 = lVar18 - lVar9;
    lVar9 = lVar9 + lVar10;
    lVar5 = **(long **)&pMVar4->field_0x48;
    lVar17 = lVar5 * uVar11 + *(long *)&pMVar4->field_0x10;
    lVar15 = lVar17 + lVar5 * -2;
    lVar5 = lVar14 + -1;
    uVar16 = uVar11 | 1;
    for (uVar19 = 0; (long)uVar19 < lVar20; uVar19 = uVar19 + 2) {
      if (*(char *)(lVar10 + uVar19) == '\0') {
        if (((long)uVar16 < lVar13) && (*(char *)(lVar9 + uVar19) != '\0')) {
          uVar8 = uVar19 | 1;
          if (((long)uVar8 < lVar20) && (*(char *)(lVar10 + uVar8) != '\0')) {
            uVar7 = 1;
            if (uVar19 != 0) {
              if (*(char *)((uVar19 - 1) + lVar10) != '\0') {
                if (uVar11 != 0) {
                  if (*(char *)(lVar18 + uVar8) == '\0') goto LAB_0011bddc;
                  goto LAB_0011bcd0;
                }
                goto LAB_0011c243;
              }
              uVar7 = uVar8;
              if (*(char *)(lVar9 + -1 + uVar19) == '\0') goto LAB_0011bd80;
              if (uVar11 == 0) goto LAB_0011c243;
              if (*(char *)(lVar18 + uVar8) == '\0') {
                if ((lVar20 <= (long)(uVar19 + 2)) || (*(char *)(lVar18 + uVar19 + 2) == '\0')) {
                  if (*(char *)(lVar18 + uVar19) == '\0') goto LAB_0011c243;
                  cVar2 = *(char *)((uVar19 - 2) + lVar10);
                  goto joined_r0x0011c238;
                }
                if (*(char *)(lVar14 + uVar8) == '\0') {
                  if (*(char *)(lVar18 + uVar19) == '\0') goto LAB_0011be0f;
                  if (*(char *)(lVar10 + -2 + uVar19) == '\0') {
                    uVar6 = RemSP::Merge(*(uint *)(lVar15 + uVar19 * 4),
                                         *(uint *)(lVar15 + 8 + uVar19 * 4));
                    uVar12 = *(uint *)(lVar17 + -8 + uVar19 * 4);
                  }
                  else {
                    if (*(char *)(lVar18 + -1 + uVar19) == '\0') goto LAB_0011c269;
                    uVar6 = *(uint *)(lVar15 + -8 + uVar19 * 4);
                    uVar12 = *(uint *)(lVar15 + 8 + uVar19 * 4);
                  }
                  uVar6 = RemSP::Merge(uVar6,uVar12);
                  *(uint *)(lVar17 + uVar19 * 4) = uVar6;
                  goto LAB_0011c24c;
                }
              }
              if (*(char *)((uVar19 - 2) + lVar10) == '\0') goto LAB_0011c137;
LAB_0011be57:
              if (uVar19 != 0 && uVar11 != 0) {
                if (*(char *)(lVar18 + -1 + uVar19) != '\0') {
LAB_0011c008:
                  if (uVar11 != 0) {
                    if (*(char *)(lVar18 + uVar19) != '\0') goto LAB_0011bf77;
                    goto LAB_0011beca;
                  }
                  goto LAB_0011c049;
                }
LAB_0011be7b:
                if (*(char *)(lVar18 + -2 + uVar19) != '\0') {
                  if (*(char *)(lVar5 + uVar19) != '\0') goto LAB_0011c008;
                  goto LAB_0011c049;
                }
              }
LAB_0011c0f3:
              uVar6 = *(uint *)(lVar15 + uVar19 * 4);
              uVar12 = *(uint *)(lVar17 + (uVar19 - 2) * 4);
LAB_0011c0ff:
              uVar6 = RemSP::Merge(uVar6,uVar12);
              *(uint *)(lVar17 + uVar19 * 4) = uVar6;
              goto LAB_0011c24c;
            }
LAB_0011bd80:
            if (((uVar11 != 0) && ((long)uVar7 < lVar20)) && (*(char *)(lVar18 + uVar7) != '\0'))
            goto LAB_0011bf37;
            if ((uVar11 == 0) || (lVar20 <= (long)(uVar19 + 2))) {
              if (uVar11 == 0) goto LAB_0011bfa7;
            }
            else if (*(char *)(lVar18 + uVar19 + 2) != '\0') {
              if (*(char *)(lVar18 + uVar19) == '\0') goto LAB_0011c0af;
              goto LAB_0011bf0c;
            }
            if (*(char *)(lVar18 + uVar19) != '\0') goto LAB_0011bf37;
          }
          else if ((uVar19 != 0) &&
                  ((*(char *)((uVar19 - 1) + lVar9) != '\0' ||
                   (*(char *)(lVar10 + -1 + uVar19) != '\0')))) goto LAB_0011c243;
LAB_0011bfa7:
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar6 = RemSP::length_ + 1;
          *(uint *)(lVar17 + uVar19 * 4) = RemSP::length_;
          RemSP::length_ = uVar6;
        }
        else {
          uVar7 = uVar19 | 1;
          if ((long)uVar7 < lVar20) {
            if (*(char *)(lVar10 + uVar7) != '\0') goto LAB_0011bd80;
            if (((long)uVar16 < lVar13) && (*(char *)(lVar9 + uVar7) != '\0')) goto LAB_0011bfa7;
          }
          *(undefined4 *)(lVar17 + uVar19 * 4) = 0;
        }
      }
      else {
        if (uVar19 == 0) {
LAB_0011be9c:
          uVar7 = uVar19 | 1;
          if ((uVar11 == 0) || ((lVar20 <= (long)uVar7 || (*(char *)(lVar18 + uVar7) == '\0')))) {
            if (((long)uVar7 < lVar20) &&
               (((*(char *)(lVar10 + uVar7) != '\0' && (uVar11 != 0)) &&
                ((long)(uVar19 + 2) < lVar20)))) {
              if (*(char *)(lVar18 + uVar19 + 2) != '\0') {
                if (*(char *)(lVar18 + uVar19) == '\0') {
                  if ((uVar19 == 0) || (*(char *)(lVar18 + -1 + uVar19) == '\0')) {
LAB_0011c0af:
                    uVar6 = *(uint *)(lVar15 + 8 + uVar19 * 4);
                    goto LAB_0011c248;
                  }
                  if (*(char *)(lVar14 + uVar7) == '\0') goto LAB_0011c0a5;
                  goto LAB_0011beca;
                }
LAB_0011bf0c:
                if ((lVar20 <= (long)uVar7) || (*(char *)(lVar14 + uVar7) == '\0')) {
                  uVar6 = *(uint *)(lVar15 + uVar19 * 4);
                  goto LAB_0011bf20;
                }
                goto LAB_0011bf37;
              }
            }
            else if (uVar11 == 0) goto LAB_0011bfa7;
            if (*(char *)(lVar18 + uVar19) != '\0') goto LAB_0011bf37;
            if ((uVar11 == 0 || uVar19 == 0) || (*(char *)(lVar18 + -1 + uVar19) == '\0'))
            goto LAB_0011bfa7;
          }
          else {
            if (((*(char *)(lVar18 + uVar19) != '\0') || (uVar19 == 0)) ||
               (*(char *)(lVar18 + -1 + uVar19) == '\0')) {
LAB_0011bf37:
              uVar6 = *(uint *)(lVar15 + uVar19 * 4);
              goto LAB_0011c248;
            }
LAB_0011beca:
            if (*(char *)(lVar14 + uVar19) == '\0') {
LAB_0011c049:
              uVar6 = *(uint *)(lVar15 + -8 + uVar19 * 4);
              goto LAB_0011c04e;
            }
          }
LAB_0011bf77:
          uVar6 = *(uint *)(lVar15 + -8 + uVar19 * 4);
        }
        else {
          if (*(char *)(lVar10 + -1 + uVar19) == '\0') {
            if ((lVar13 <= (long)uVar16) || (*(char *)(lVar9 + -1 + uVar19) == '\0'))
            goto LAB_0011be9c;
            uVar7 = uVar19 | 1;
            if (((uVar11 != 0) && ((long)uVar7 < lVar20)) && (*(char *)(lVar18 + uVar7) != '\0')) {
              if (*(char *)((uVar19 - 2) + lVar10) != '\0') goto LAB_0011be57;
              if ((*(char *)(lVar18 + uVar19) != '\0') || (*(char *)(lVar18 + -1 + uVar19) == '\0'))
              goto LAB_0011c137;
LAB_0011c17c:
              if ((uVar11 == 0) || (*(char *)(lVar14 + uVar19) == '\0')) {
                uVar6 = *(uint *)(lVar15 + -8 + uVar19 * 4);
                uVar12 = *(uint *)(lVar15 + uVar19 * 4);
LAB_0011c2d9:
                uVar6 = RemSP::Merge(uVar6,uVar12);
                uVar12 = *(uint *)(lVar17 + -8 + uVar19 * 4);
              }
              else {
                uVar6 = *(uint *)(lVar15 + -8 + uVar19 * 4);
LAB_0011c212:
                uVar12 = *(uint *)(lVar17 + -8 + uVar19 * 4);
              }
              goto LAB_0011c0ff;
            }
            if ((lVar20 <= (long)uVar7) ||
               ((((*(char *)(lVar10 + uVar7) == '\0' || (uVar11 == 0)) ||
                 (lVar20 <= (long)(uVar19 + 2))) || (*(char *)(lVar18 + uVar19 + 2) == '\0')))) {
              if (uVar11 == 0) goto LAB_0011c243;
              if (*(char *)(lVar18 + -1 + uVar19) == '\0') {
                if (*(char *)(lVar18 + uVar19) == '\0') goto LAB_0011c243;
                if (*(char *)((uVar19 - 2) + lVar10) == '\0') goto LAB_0011c137;
                goto LAB_0011c0cd;
              }
              uVar6 = *(uint *)(lVar15 + -8 + uVar19 * 4);
              if (*(char *)(lVar10 + -2 + uVar19) == '\0') goto LAB_0011c13b;
LAB_0011c0ea:
              *(uint *)(lVar17 + uVar19 * 4) = uVar6;
              goto LAB_0011c24c;
            }
            if (*(char *)(lVar10 + -2 + uVar19) == '\0') {
              if (*(char *)(lVar18 + uVar19) != '\0') {
                uVar6 = *(uint *)(lVar15 + uVar19 * 4);
                if (*(char *)(lVar14 + uVar7) == '\0') {
                  uVar12 = *(uint *)(lVar15 + 8 + uVar19 * 4);
                  goto LAB_0011c2d9;
                }
                goto LAB_0011c212;
              }
              if (*(char *)(lVar18 + -1 + uVar19) == '\0') goto LAB_0011be0f;
              if (*(char *)(lVar14 + uVar7) != '\0') goto LAB_0011c17c;
              uVar6 = RemSP::Merge(*(uint *)(lVar15 + -8 + uVar19 * 4),
                                   *(uint *)(lVar15 + 8 + uVar19 * 4));
              uVar12 = *(uint *)(lVar17 + -8 + uVar19 * 4);
              goto LAB_0011c140;
            }
            if (*(char *)(lVar18 + -1 + uVar19) == '\0') {
              if (*(char *)(lVar14 + uVar7) != '\0') goto LAB_0011be7b;
              if (*(char *)(lVar18 + uVar19) != '\0') {
LAB_0011c269:
                lVar1 = uVar19 - 2;
                if ((uVar19 == 0 || uVar11 == 0) || (*(char *)(lVar18 + lVar1) == '\0')) {
                  uVar6 = RemSP::Merge(*(uint *)(lVar15 + uVar19 * 4),
                                       *(uint *)(lVar15 + 8 + uVar19 * 4));
                  uVar12 = *(uint *)(lVar17 + lVar1 * 4);
                  goto LAB_0011c140;
                }
                if (*(char *)(lVar5 + uVar19) == '\0') {
                  uVar6 = RemSP::Merge(*(uint *)(lVar15 + uVar19 * 4),
                                       *(uint *)(lVar15 + 8 + uVar19 * 4));
                  uVar12 = *(uint *)(lVar17 + lVar1 * 4);
                }
                else {
                  uVar6 = *(uint *)(lVar15 + lVar1 * 4);
                  uVar12 = *(uint *)(lVar15 + 8 + uVar19 * 4);
                }
                goto LAB_0011c0ff;
              }
LAB_0011be0f:
              uVar6 = *(uint *)(lVar15 + 8 + uVar19 * 4);
              goto LAB_0011c13b;
            }
            if (*(char *)(lVar14 + uVar7) != '\0') goto LAB_0011c008;
LAB_0011c0a5:
            uVar6 = *(uint *)(lVar15 + -8 + uVar19 * 4);
LAB_0011bf20:
            uVar12 = *(uint *)(lVar15 + 8 + uVar19 * 4);
          }
          else {
            uVar7 = uVar19 | 1;
            if (((uVar11 == 0) || (lVar20 <= (long)uVar7)) || (*(char *)(lVar18 + uVar7) == '\0')) {
              if (((long)uVar7 < lVar20) && (*(char *)(lVar10 + uVar7) != '\0')) {
LAB_0011bddc:
                if ((uVar11 != 0) &&
                   (((long)(uVar19 + 2) < lVar20 && (*(char *)(lVar18 + uVar19 + 2) != '\0')))) {
                  if (*(char *)(lVar14 + 1 + uVar19) == '\0') goto LAB_0011be0f;
                  goto LAB_0011bcd0;
                }
              }
LAB_0011c243:
              uVar6 = *(uint *)(lVar17 + -8 + uVar19 * 4);
              goto LAB_0011c248;
            }
LAB_0011bcd0:
            if (*(char *)(lVar18 + uVar19) != '\0') goto LAB_0011bf37;
            cVar2 = *(char *)(lVar14 + uVar19);
joined_r0x0011c238:
            if (cVar2 == '\0') {
LAB_0011c137:
              uVar6 = *(uint *)(lVar15 + uVar19 * 4);
LAB_0011c13b:
              uVar12 = *(uint *)(lVar17 + -8 + uVar19 * 4);
              goto LAB_0011c140;
            }
            if (uVar19 == 0 || uVar11 == 0) goto LAB_0011c0f3;
            if (*(char *)(lVar18 + -1 + uVar19) != '\0') goto LAB_0011bf77;
LAB_0011c0cd:
            if (*(char *)(lVar18 + -2 + uVar19) == '\0') goto LAB_0011c0f3;
            uVar6 = *(uint *)(lVar15 + -8 + uVar19 * 4);
            if (*(char *)(lVar5 + uVar19) != '\0') goto LAB_0011c0ea;
LAB_0011c04e:
            uVar12 = *(uint *)(lVar15 + uVar19 * 4);
          }
LAB_0011c140:
          uVar6 = RemSP::Merge(uVar6,uVar12);
        }
LAB_0011c248:
        *(uint *)(lVar17 + uVar19 * 4) = uVar6;
      }
LAB_0011c24c:
    }
    uVar11 = uVar11 + 2;
  } while( true );
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }